

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::CallsAccessor(Instr *this,PropertySymOpnd *methodOpnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (methodOpnd == (PropertySymOpnd *)0x0) {
    bVar2 = CallsGetter(this);
    if (bVar2) {
      return true;
    }
    bVar2 = CallsSetter(this);
    return bVar2;
  }
  if (methodOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe7b,"(methodOpnd->HasObjTypeSpecFldInfo())",
                       "methodOpnd->HasObjTypeSpecFldInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = PropertySymOpnd::UsesAccessor(methodOpnd);
  return bVar2;
}

Assistant:

bool Instr::CallsAccessor(IR::PropertySymOpnd * methodOpnd)
{
    if (methodOpnd)
    {
        Assert(methodOpnd->HasObjTypeSpecFldInfo());
        return methodOpnd->UsesAccessor();
    }

    return CallsGetter() || CallsSetter();
}